

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  uint uVar2;
  LookasideSlot *pLVar3;
  LookasideSlot *pLVar4;
  ulong uVar5;
  uint uVar6;
  LookasideSlot *p;
  bool bVar7;
  
  if ((db->lookaside).nOut == 0) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    uVar6 = sz & 0xfffffff8;
    uVar2 = uVar6;
    if ((int)uVar6 < 9) {
      uVar2 = 0;
    }
    uVar5 = (ulong)(uint)cnt;
    if (cnt < 1) {
      uVar5 = 0;
    }
    if (cnt < 1 || (int)uVar6 < 9) {
      pLVar3 = (LookasideSlot *)0x0;
      uVar2 = 0;
    }
    else {
      pLVar3 = (LookasideSlot *)pBuf;
      if (pBuf == (void *)0x0) {
        if (sqlite3Hooks_0 != (code *)0x0) {
          (*sqlite3Hooks_0)();
        }
        pLVar3 = (LookasideSlot *)sqlite3Malloc((ulong)((int)uVar5 * uVar6));
        if (sqlite3Hooks_1 != (code *)0x0) {
          (*sqlite3Hooks_1)();
        }
        if (pLVar3 == (LookasideSlot *)0x0) {
          pLVar3 = (LookasideSlot *)0x0;
        }
        else {
          iVar1 = (*sqlite3Config.m.xSize)(pLVar3);
          uVar5 = (long)iVar1 / (long)(int)uVar6 & 0xffffffff;
        }
      }
    }
    (db->lookaside).pStart = pLVar3;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar2;
    if (pLVar3 == (LookasideSlot *)0x0) {
      (db->lookaside).pStart = db;
      (db->lookaside).pEnd = db;
      (db->lookaside).bDisable = 1;
      bVar7 = false;
    }
    else {
      pLVar4 = (LookasideSlot *)0x0;
      for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
        pLVar3->pNext = pLVar4;
        (db->lookaside).pFree = pLVar3;
        pLVar4 = pLVar3;
        pLVar3 = (LookasideSlot *)((long)&pLVar3->pNext + (ulong)uVar2);
      }
      (db->lookaside).pEnd = pLVar3;
      (db->lookaside).bDisable = 0;
      bVar7 = pBuf == (void *)0x0;
    }
    (db->lookaside).bMalloced = bVar7;
    return 0;
  }
  return 5;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  if( db->lookaside.nOut ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pFree;
      db->lookaside.pFree = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pStart = db;
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.bMalloced = 0;
  }
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}